

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_event.c
# Opt level: O0

int s_event_wait(s_awaiter_t *__awaiter_dummy__,s_event_t *event)

{
  int iVar1;
  long *in_FS_OFFSET;
  int ret;
  s_event_t *event_local;
  s_awaiter_t *__awaiter_dummy___local;
  
  s_event_add_to_waiting_list(event);
  s_list_detach(*(s_list_t **)(*in_FS_OFFSET + -0xe8));
  s_list_attach(&event->wait_list,*(s_list_t **)(*in_FS_OFFSET + -0xe8));
  s_task_next(__awaiter_dummy__);
  iVar1 = 0;
  if ((*(byte *)(*(long *)(*in_FS_OFFSET + -0xe8) + 0x50) & 1) != 0) {
    iVar1 = -1;
  }
  *(undefined1 *)(*(long *)(*in_FS_OFFSET + -0xe8) + 0x50) = 0;
  return iVar1;
}

Assistant:

int s_event_wait(__async__, s_event_t *event) {
    int ret;
    /* Put current task to the event's waiting list */
    s_event_add_to_waiting_list(event);
    s_list_detach(&g_globals.current_task->node);   /* no need, for safe */
    s_list_attach(&event->wait_list, &g_globals.current_task->node);
    s_task_next(__await__);
    ret = (g_globals.current_task->waiting_cancelled ? -1 : 0);
    g_globals.current_task->waiting_cancelled = false;
    return ret;
}